

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getFontFromResource
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *resources,string *name)

{
  element_type *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle local_d8;
  string local_c0;
  long *local_a0 [2];
  long local_90 [2];
  QPDFObjectHandle local_80;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)0x0;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)name);
  _Var6._M_pi = extraout_RDX;
  if (bVar3) {
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/Font","");
    QPDFObjectHandle::getKey(&local_80,name);
    bVar4 = QPDFObjectHandle::isDictionary(&local_80);
    _Var6._M_pi = extraout_RDX_00;
    if (bVar4) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/Font","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c0.field_2,name);
      bVar5 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_c0.field_2,in_RCX);
      bVar4 = true;
      _Var6._M_pi = extraout_RDX_01;
      goto LAB_0016e294;
    }
  }
  bVar4 = false;
  bVar5 = false;
LAB_0016e294:
  if (bVar4) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0.field_2._8_8_);
      _Var6._M_pi = extraout_RDX_02;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
      _Var6._M_pi = extraout_RDX_03;
    }
  }
  if (bVar3) {
    if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_04;
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
      _Var6._M_pi = extraout_RDX_05;
    }
  }
  if (bVar5 != false) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/Font","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c0,name);
    QVar7 = QPDFObjectHandle::getKey(&local_d8,&local_c0);
    _Var2._M_pi = local_d8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar1 = local_d8.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var6._M_pi = QVar7.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)peVar1;
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var2._M_pi;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      _Var6._M_pi = extraout_RDX_06;
    }
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_07;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length);
      _Var6._M_pi = extraout_RDX_08;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
      _Var6._M_pi = extraout_RDX_09;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getFontFromResource(QPDFObjectHandle resources, std::string const& name)
{
    QPDFObjectHandle result;
    if (resources.isDictionary() && resources.getKey("/Font").isDictionary() &&
        resources.getKey("/Font").hasKey(name)) {
        result = resources.getKey("/Font").getKey(name);
    }
    return result;
}